

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O1

int Cec_ManSimSimulateRound(Cec_ManSim_t *p,Vec_Ptr_t *vInfoCis,Vec_Ptr_t *vInfoCos)

{
  Gia_Obj_t *pGVar1;
  void *pvVar2;
  Gia_Rpr_t *pGVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  uint *puVar9;
  Gia_Man_t *pGVar10;
  uint *puVar11;
  uint *puVar12;
  Vec_Int_t *pVVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  
  if (p->nWordsOld != p->nWords) {
    Cec_ManSimMemRelink(p);
  }
  p->nMemsMax = 0;
  if (p->pScores != (int *)0x0) {
    free(p->pScores);
    p->pScores = (int *)0x0;
  }
  if (p->pBestState != (Abc_Cex_t *)0x0) {
    piVar8 = (int *)calloc((long)p->nWords << 5,4);
    p->pScores = piVar8;
  }
  p->vRefinedC->nSize = 0;
  if ((p->pAig->pObjs->Value != 0) && (puVar9 = Cec_ManSimSimRef(p,0), 0 < p->nWords)) {
    lVar14 = 0;
    do {
      puVar9[lVar14 + 1] = 0;
      lVar14 = lVar14 + 1;
    } while (lVar14 < p->nWords);
  }
  pGVar10 = p->pAig;
  uVar5 = 0;
  uVar17 = 0;
  if (1 < pGVar10->nObjs) {
    uVar17 = 0;
    lVar14 = 1;
    uVar5 = 0;
    do {
      pGVar1 = pGVar10->pObjs + lVar14;
      uVar4 = (uint)*(ulong *)pGVar1;
      iVar7 = (int)lVar14;
      if ((~uVar4 & 0x9fffffff) == 0) {
        if (pGVar1->Value == 0) {
          uVar5 = uVar5 + 1;
        }
        else {
          puVar9 = Cec_ManSimSimRef(p,iVar7);
          if (vInfoCis == (Vec_Ptr_t *)0x0) {
            uVar4 = uVar5;
            if (0 < p->nWords) {
              lVar15 = 0;
              do {
                uVar5 = Gia_ManRandom(0);
                puVar9[lVar15 + 1] = uVar5;
                lVar15 = lVar15 + 1;
              } while (lVar15 < p->nWords);
            }
          }
          else {
            if (((int)uVar5 < 0) || (vInfoCis->nSize <= (int)uVar5)) {
LAB_005c41b3:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            uVar4 = uVar5 + 1;
            if (0 < p->nWords) {
              pvVar2 = vInfoCis->pArray[uVar5];
              lVar15 = 0;
              do {
                puVar9[lVar15 + 1] = *(uint *)((long)pvVar2 + lVar15 * 4);
                lVar15 = lVar15 + 1;
              } while (lVar15 < p->nWords);
            }
          }
          uVar5 = uVar4;
          *(byte *)(puVar9 + 1) = (byte)puVar9[1] & 0xfe;
LAB_005c3ed1:
          if (((uint)p->pAig->pReprs[lVar14] & 0xfffffff) == 0) {
            iVar6 = Cec_ManSimCompareConst(puVar9 + 1,p->nWords);
            if (iVar6 == 0) {
              *puVar9 = *puVar9 + 1;
              Vec_IntPush(p->vRefinedC,iVar7);
              if (p->pBestState != (Abc_Cex_t *)0x0) {
                Cec_ManSimCompareConstScore(puVar9 + 1,p->nWords,p->pScores);
              }
            }
          }
          pGVar10 = p->pAig;
          pGVar3 = pGVar10->pReprs;
          if (((((uint)pGVar3[lVar14] & 0xfffffff) != 0xfffffff) &&
              (((uint)pGVar3[lVar14] & 0xfffffff) != 0)) || (0 < pGVar10->pNexts[lVar14])) {
            *puVar9 = *puVar9 + 1;
          }
          if (((((uint)pGVar3[lVar14] & 0xfffffff) != 0) &&
              (((uint)pGVar3[lVar14] & 0xfffffff) != 0xfffffff)) && (pGVar10->pNexts[lVar14] == 0))
          {
            p->vClassTemp->nSize = 0;
            uVar16 = (ulong)((uint)pGVar3[lVar14] & 0xfffffff);
            if (((~(uint)pGVar3[uVar16] & 0xfffffff) != 0) || (pGVar10->pNexts[uVar16] < 1)) {
              __assert_fail("Gia_ObjIsHead(p->pAig, Gia_ObjRepr(p->pAig, i))",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                            ,0x2f3,
                            "int Cec_ManSimSimulateRound(Cec_ManSim_t *, Vec_Ptr_t *, Vec_Ptr_t *)")
              ;
            }
            while (iVar7 = (int)uVar16, iVar7 != 0) {
              Vec_IntPush(p->vClassTemp,iVar7);
              uVar16 = (ulong)(uint)p->pAig->pNexts[iVar7];
            }
            Cec_ManSimClassRefineOne(p,(uint)p->pAig->pReprs[lVar14] & 0xfffffff);
            pVVar13 = p->vClassTemp;
            if (0 < pVVar13->nSize) {
              lVar15 = 0;
              do {
                Cec_ManSimSimDeref(p,pVVar13->pArray[lVar15]);
                lVar15 = lVar15 + 1;
                pVVar13 = p->vClassTemp;
              } while (lVar15 < pVVar13->nSize);
            }
          }
        }
      }
      else {
        if ((~uVar4 & 0x1fffffff) == 0 || -1 < (int)uVar4) {
          if (pGVar1->Value == 0) {
            __assert_fail("Gia_ObjValue(pObj)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                          ,0x2c9,
                          "int Cec_ManSimSimulateRound(Cec_ManSim_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
          }
          puVar9 = Cec_ManSimSimRef(p,iVar7);
          puVar11 = Cec_ManSimSimDeref(p,iVar7 - (*(uint *)pGVar1 & 0x1fffffff));
          puVar12 = Cec_ManSimSimDeref(p,iVar7 - (*(uint *)&pGVar1->field_0x4 & 0x1fffffff));
          uVar16 = *(ulong *)pGVar1;
          iVar6 = p->nWords;
          if (((uint)uVar16 >> 0x1d & 1) == 0) {
            if ((uVar16 >> 0x3d & 1) == 0) {
              if (0 < iVar6) {
                lVar15 = 0;
                do {
                  puVar9[lVar15 + 1] = puVar12[lVar15 + 1] & puVar11[lVar15 + 1];
                  lVar15 = lVar15 + 1;
                } while (lVar15 < p->nWords);
              }
            }
            else if (0 < iVar6) {
              lVar15 = 0;
              do {
                puVar9[lVar15 + 1] = ~puVar12[lVar15 + 1] & puVar11[lVar15 + 1];
                lVar15 = lVar15 + 1;
              } while (lVar15 < p->nWords);
            }
          }
          else if ((uVar16 >> 0x3d & 1) == 0) {
            if (0 < iVar6) {
              lVar15 = 0;
              do {
                puVar9[lVar15 + 1] = ~puVar11[lVar15 + 1] & puVar12[lVar15 + 1];
                lVar15 = lVar15 + 1;
              } while (lVar15 < p->nWords);
            }
          }
          else if (0 < iVar6) {
            lVar15 = 0;
            do {
              puVar9[lVar15 + 1] = ~(puVar12[lVar15 + 1] | puVar11[lVar15 + 1]);
              lVar15 = lVar15 + 1;
            } while (lVar15 < p->nWords);
          }
          goto LAB_005c3ed1;
        }
        puVar9 = Cec_ManSimSimDeref(p,iVar7 - (uVar4 & 0x1fffffff));
        if (vInfoCos != (Vec_Ptr_t *)0x0) {
          if (((int)uVar17 < 0) || (vInfoCos->nSize <= (int)uVar17)) goto LAB_005c41b3;
          uVar16 = (ulong)uVar17;
          uVar17 = uVar17 + 1;
          pvVar2 = vInfoCos->pArray[uVar16];
          if ((pGVar1->field_0x3 & 0x20) == 0) {
            if (0 < p->nWords) {
              lVar15 = 0;
              do {
                *(uint *)((long)pvVar2 + lVar15 * 4) = puVar9[lVar15 + 1];
                lVar15 = lVar15 + 1;
              } while (lVar15 < p->nWords);
            }
          }
          else if (0 < p->nWords) {
            lVar15 = 0;
            do {
              *(uint *)((long)pvVar2 + lVar15 * 4) = ~puVar9[lVar15 + 1];
              lVar15 = lVar15 + 1;
            } while (lVar15 < p->nWords);
          }
        }
      }
      lVar14 = lVar14 + 1;
      pGVar10 = p->pAig;
    } while (lVar14 < pGVar10->nObjs);
  }
  if (p->pPars->fConstCorr != 0) {
    pVVar13 = p->vRefinedC;
    if (0 < pVVar13->nSize) {
      lVar14 = 0;
      do {
        iVar7 = pVVar13->pArray[lVar14];
        pGVar3 = p->pAig->pReprs + iVar7;
        *pGVar3 = (Gia_Rpr_t)((uint)*pGVar3 | 0xfffffff);
        Cec_ManSimSimDeref(p,iVar7);
        lVar14 = lVar14 + 1;
        pVVar13 = p->vRefinedC;
      } while (lVar14 < pVVar13->nSize);
    }
    pVVar13->nSize = 0;
  }
  if (0 < p->vRefinedC->nSize) {
    Cec_ManSimProcessRefined(p,p->vRefinedC);
  }
  if ((vInfoCis != (Vec_Ptr_t *)0x0) && (uVar5 != p->pAig->vCis->nSize)) {
    __assert_fail("vInfoCis == NULL || iCiId == Gia_ManCiNum(p->pAig)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                  ,0x307,"int Cec_ManSimSimulateRound(Cec_ManSim_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  if ((vInfoCos != (Vec_Ptr_t *)0x0) && (uVar17 != p->pAig->vCos->nSize)) {
    __assert_fail("vInfoCos == NULL || iCoId == Gia_ManCoNum(p->pAig)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                  ,0x308,"int Cec_ManSimSimulateRound(Cec_ManSim_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  if (p->nMems != 1) {
    __assert_fail("p->nMems == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                  ,0x309,"int Cec_ManSimSimulateRound(Cec_ManSim_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  if (p->pPars->fVeryVerbose != 0) {
    Gia_ManEquivPrintClasses
              (p->pAig,0,(float)(p->pPars->nWords + 1) * (float)p->nMemsMax * 9.536743e-07);
  }
  if (p->pBestState != (Abc_Cex_t *)0x0) {
    Cec_ManSimFindBestPattern(p);
  }
  iVar7 = Cec_ManSimAnalyzeOutputs(p);
  return iVar7;
}

Assistant:

int Cec_ManSimSimulateRound( Cec_ManSim_t * p, Vec_Ptr_t * vInfoCis, Vec_Ptr_t * vInfoCos )
{
    Gia_Obj_t * pObj;
    unsigned * pRes0, * pRes1, * pRes;
    int i, k, w, Ent, iCiId = 0, iCoId = 0;
    // prepare internal storage
    if ( p->nWordsOld != p->nWords )
        Cec_ManSimMemRelink( p );
    p->nMemsMax = 0;
    // allocate score counters
    ABC_FREE( p->pScores );
    if ( p->pBestState )
        p->pScores = ABC_CALLOC( int, 32 * p->nWords );
    // simulate nodes
    Vec_IntClear( p->vRefinedC );
    if ( Gia_ObjValue(Gia_ManConst0(p->pAig)) )
    {
        pRes = Cec_ManSimSimRef( p, 0 );
        for ( w = 1; w <= p->nWords; w++ )
            pRes[w] = 0;
    }
    Gia_ManForEachObj1( p->pAig, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) ) 
        {
            if ( Gia_ObjValue(pObj) == 0 )
            {
                iCiId++;
                continue;
            }
            pRes = Cec_ManSimSimRef( p, i );
            if ( vInfoCis ) 
            {
                pRes0 = (unsigned *)Vec_PtrEntry( vInfoCis, iCiId++ );
                for ( w = 1; w <= p->nWords; w++ )
                    pRes[w] = pRes0[w-1];
            }
            else
            {
                for ( w = 1; w <= p->nWords; w++ )
                    pRes[w] = Gia_ManRandom( 0 );
            }
            // make sure the first pattern is always zero
            pRes[1] ^= (pRes[1] & 1);
            goto references;
        }
        if ( Gia_ObjIsCo(pObj) ) // co always has non-zero 1st fanin and zero 2nd fanin
        {
            pRes0 = Cec_ManSimSimDeref( p, Gia_ObjFaninId0(pObj,i) );
            if ( vInfoCos )
            {
                pRes = (unsigned *)Vec_PtrEntry( vInfoCos, iCoId++ );
                if ( Gia_ObjFaninC0(pObj) )
                    for ( w = 1; w <= p->nWords; w++ )
                        pRes[w-1] = ~pRes0[w];
                else 
                    for ( w = 1; w <= p->nWords; w++ )
                        pRes[w-1] = pRes0[w];
            }
            continue;
        }
        assert( Gia_ObjValue(pObj) );
        pRes  = Cec_ManSimSimRef( p, i );
        pRes0 = Cec_ManSimSimDeref( p, Gia_ObjFaninId0(pObj,i) );
        pRes1 = Cec_ManSimSimDeref( p, Gia_ObjFaninId1(pObj,i) );

//        Abc_Print( 1, "%d,%d  ", Gia_ObjValue( Gia_ObjFanin0(pObj) ), Gia_ObjValue( Gia_ObjFanin1(pObj) ) );

        if ( Gia_ObjFaninC0(pObj) )
        {
            if ( Gia_ObjFaninC1(pObj) )
                for ( w = 1; w <= p->nWords; w++ )
                    pRes[w] = ~(pRes0[w] | pRes1[w]);
            else
                for ( w = 1; w <= p->nWords; w++ )
                    pRes[w] = ~pRes0[w] & pRes1[w];
        }
        else
        {
            if ( Gia_ObjFaninC1(pObj) )
                for ( w = 1; w <= p->nWords; w++ )
                    pRes[w] = pRes0[w] & ~pRes1[w];
            else
                for ( w = 1; w <= p->nWords; w++ )
                    pRes[w] = pRes0[w] & pRes1[w];
        }

references:
        // if this node is candidate constant, collect it
        if ( Gia_ObjIsConst(p->pAig, i) && !Cec_ManSimCompareConst(pRes + 1, p->nWords) )
        {
            pRes[0]++;
            Vec_IntPush( p->vRefinedC, i );
            if ( p->pBestState )
                Cec_ManSimCompareConstScore( pRes + 1, p->nWords, p->pScores );
        }
        // if the node belongs to a class, save it
        if ( Gia_ObjIsClass(p->pAig, i) )
            pRes[0]++;
        // if this is the last node of the class, process it
        if ( Gia_ObjIsTail(p->pAig, i) )
        {
            Vec_IntClear( p->vClassTemp );
            Gia_ClassForEachObj( p->pAig, Gia_ObjRepr(p->pAig, i), Ent )
                Vec_IntPush( p->vClassTemp, Ent );
            Cec_ManSimClassRefineOne( p, Gia_ObjRepr(p->pAig, i) );
            Vec_IntForEachEntry( p->vClassTemp, Ent, k )
                Cec_ManSimSimDeref( p, Ent );
        }
    }

    if ( p->pPars->fConstCorr )
    {
        Vec_IntForEachEntry( p->vRefinedC, i, k )
        {
            Gia_ObjSetRepr( p->pAig, i, GIA_VOID );
            Cec_ManSimSimDeref( p, i );
        }
        Vec_IntClear( p->vRefinedC );
    }

    if ( Vec_IntSize(p->vRefinedC) > 0 )
        Cec_ManSimProcessRefined( p, p->vRefinedC );
    assert( vInfoCis == NULL || iCiId == Gia_ManCiNum(p->pAig) );
    assert( vInfoCos == NULL || iCoId == Gia_ManCoNum(p->pAig) );
    assert( p->nMems == 1 );
    if ( p->nMems != 1 )
        Abc_Print( 1, "Cec_ManSimSimulateRound(): Memory management error!\n" );
    if ( p->pPars->fVeryVerbose )
        Gia_ManEquivPrintClasses( p->pAig, 0, Cec_MemUsage(p) );
    if ( p->pBestState )
        Cec_ManSimFindBestPattern( p );
/*
    if ( p->nMems > 1 ) {
        for ( i = 1; i < p->nObjs; i++ )
        if ( p->pSims[i] ) {
            int x = 0;
        }
    }
*/
    return Cec_ManSimAnalyzeOutputs( p );
}